

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O1

void so_5::ensure_message_with_actual_data<so_5::stats::messages::distribution_started>
               (distribution_started *m)

{
  exception_t *this;
  string local_40;
  
  if (m != (distribution_started *)0x0) {
    return;
  }
  this = (exception_t *)__cxa_allocate_exception(0x18);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"an attempt to send a message via nullptr","");
  exception_t::exception_t(this,&local_40,0x52);
  __cxa_throw(this,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

void
ensure_message_with_actual_data( const MSG * m )
{
	ensure_not_signal< MSG >();

	if( !m )
		throw so_5::exception_t(
				"an attempt to send a message via nullptr",
				so_5::rc_null_message_data );
}